

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturehelper.cpp
# Opt level: O1

void __thiscall
QOpenGLTextureHelper::qt_TextureImage3DMultisample
          (QOpenGLTextureHelper *this,GLuint texture,GLenum target,GLenum bindingTarget,
          GLsizei samples,GLint internalFormat,GLsizei width,GLsizei height,GLsizei depth,
          GLboolean fixedSampleLocations)

{
  QOpenGLFunctions *pQVar1;
  GLenum GVar2;
  GLenum GVar3;
  long in_FS_OFFSET;
  bool bVar4;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_3c = 0xaaaaaaaa;
  pQVar1 = this->functions;
  bVar4 = 5 < target - 0x8515;
  GVar2 = 0x8513;
  if (bVar4) {
    GVar2 = target;
  }
  GVar3 = 0x8514;
  if (bVar4) {
    GVar3 = bindingTarget;
  }
  (**(code **)(*(long *)pQVar1 + 200))(GVar3,&uStack_3c);
  (*(code *)**(undefined8 **)pQVar1)(GVar2,texture);
  (*this->TexImage3DMultisample)
            (target,samples,internalFormat,width,height,depth,fixedSampleLocations);
  (*(code *)**(undefined8 **)pQVar1)(GVar2,uStack_3c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureHelper::qt_TextureImage3DMultisample(GLuint texture, GLenum target, GLenum bindingTarget, GLsizei samples, GLint internalFormat, GLsizei width, GLsizei height, GLsizei depth, GLboolean fixedSampleLocations)
{
    TextureBinder binder(functions, texture, target, bindingTarget);
    glTexImage3DMultisample(target, samples, internalFormat, width, height, depth, fixedSampleLocations);
}